

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void __thiscall clask::server_t::parse_tree(server_t *this,node *n,string *s,func_t *fn)

{
  char cVar1;
  node *pnVar2;
  size_t sVar3;
  pointer p_Var4;
  pointer p_Var5;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s2;
  func_t *pfVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  node *n_00;
  pointer p_Var10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sub;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_t local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  func_t *local_118;
  node *local_110;
  string *local_108;
  server_t *local_100;
  undefined1 local_f8 [32];
  size_t local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Any_data local_c0;
  _Manager_type local_b0;
  _Invoker_type p_Stack_a8;
  _Any_data local_a0;
  _Manager_type local_90;
  _Invoker_type p_Stack_88;
  _Any_data local_80;
  _Manager_type local_70;
  _Invoker_type p_Stack_68;
  bool local_60;
  string local_50;
  
  local_118 = fn;
  local_100 = this;
  lVar8 = std::__cxx11::string::find((char)s,0x2f);
  cVar1 = (s->_M_dataplus)._M_p[1];
  if (lVar8 == -1) {
    std::__cxx11::string::substr((ulong)&local_138,(ulong)s);
    sVar3 = local_130;
    __s2 = local_138;
    p_Var4 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var5 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_110 = n;
    if (p_Var4 != p_Var5) {
      bVar9 = false;
      do {
        p_Var10 = p_Var4 + 1;
        __n = (p_Var4->name)._M_string_length;
        if (__n == sVar3) {
          if (__n == 0) {
            bVar11 = true;
          }
          else {
            iVar7 = bcmp((p_Var4->name)._M_dataplus._M_p,__s2,__n);
            bVar11 = iVar7 == 0;
          }
        }
        else {
          bVar11 = false;
        }
        if (bVar11) {
          bVar9 = true;
          break;
        }
        p_Var4 = p_Var10;
      } while (p_Var10 != p_Var5);
      if (bVar9) goto LAB_0010bc30;
    }
    pfVar6 = local_118;
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_f8._16_8_ = 0;
    if (local_138 == &local_128) {
      local_d0._8_8_ = local_128._8_8_;
      local_f8._24_8_ = &local_d0;
    }
    else {
      local_f8._24_8_ = local_138;
    }
    local_d0._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
    local_d0._M_local_buf[0] = local_128._M_local_buf[0];
    local_d8 = local_130;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_138 = &local_128;
    std::function<void_(clask::response_writer_&,_clask::request_&)>::function
              ((function<void_(clask::response_writer_&,_clask::request_&)> *)&local_c0,
               &local_118->f_writer);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
                *)&local_a0,&pfVar6->f_string);
    std::function<clask::response_(clask::request_&)>::function
              ((function<clask::response_(clask::request_&)> *)&local_80,&pfVar6->f_response);
    local_60 = cVar1 == ':';
    std::vector<clask::_node,std::allocator<clask::_node>>::emplace_back<clask::_node&>
              ((vector<clask::_node,std::allocator<clask::_node>> *)local_110,(_node *)local_f8);
    if (local_70 != (_Manager_type)0x0) {
      (*local_70)(&local_80,&local_80,__destroy_functor);
    }
    if (local_90 != (_Manager_type)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
    if (local_b0 != (_Manager_type)0x0) {
      (*local_b0)(&local_c0,&local_c0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._24_8_ != &local_d0) goto LAB_0010bc19;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_138,(ulong)s);
    if (cVar1 == ':') {
      std::__cxx11::string::substr((ulong)local_f8,(ulong)&local_138);
      std::__cxx11::string::operator=((string *)&local_138,(string *)local_f8);
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
    }
    n_00 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
           super__Vector_impl_data._M_start;
    pnVar2 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_108 = s;
    if (n_00 != pnVar2) {
      bVar9 = false;
      local_110 = n;
      do {
        sVar3 = (n_00->name)._M_string_length;
        if (sVar3 == local_130) {
          if (sVar3 == 0) {
            bVar11 = true;
          }
          else {
            iVar7 = bcmp((n_00->name)._M_dataplus._M_p,local_138,sVar3);
            bVar11 = iVar7 == 0;
          }
        }
        else {
          bVar11 = false;
        }
        if (bVar11) {
          std::__cxx11::string::substr((ulong)local_f8,(ulong)local_108);
          parse_tree(local_100,n_00,(string *)local_f8,local_118);
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
          }
          bVar9 = true;
        }
        n_00 = n_00 + 1;
      } while (!(bool)(bVar11 | n_00 == pnVar2));
      n = local_110;
      if (bVar9) goto LAB_0010bc30;
    }
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_f8._16_8_ = 0;
    if (local_138 == &local_128) {
      local_d0._8_8_ = local_128._8_8_;
      local_f8._24_8_ = &local_d0;
    }
    else {
      local_f8._24_8_ = local_138;
    }
    local_d0._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
    local_d0._M_local_buf[0] = local_128._M_local_buf[0];
    local_d8 = local_130;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_c0._M_unused._M_object = (void *)0x0;
    local_c0._8_8_ = 0;
    local_b0 = (_Manager_type)0x0;
    p_Stack_a8 = (_Invoker_type)0x0;
    local_a0._M_unused._M_object = (void *)0x0;
    local_a0._8_8_ = 0;
    local_90 = (_Manager_type)0x0;
    p_Stack_88 = (_Invoker_type)0x0;
    local_80._M_unused._M_object = (void *)0x0;
    local_80._8_8_ = 0;
    local_70 = (_Manager_type)0x0;
    p_Stack_68 = (_Invoker_type)0x0;
    local_138 = &local_128;
    local_60 = cVar1 == ':';
    std::__cxx11::string::substr((ulong)&local_50,(ulong)local_108);
    parse_tree(local_100,(node *)local_f8,&local_50,local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::vector<clask::_node,_std::allocator<clask::_node>_>::emplace_back<clask::_node>
              (&n->children,(_node *)local_f8);
    if (local_70 != (_Manager_type)0x0) {
      (*local_70)(&local_80,&local_80,__destroy_functor);
    }
    if (local_90 != (_Manager_type)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
    if (local_b0 != (_Manager_type)0x0) {
      (*local_b0)(&local_c0,&local_c0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._24_8_ != &local_d0) {
LAB_0010bc19:
      operator_delete((void *)local_f8._24_8_,local_d0._M_allocated_capacity + 1);
    }
  }
  std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector
            ((vector<clask::_node,_std::allocator<clask::_node>_> *)local_f8);
LAB_0010bc30:
  if (local_138 != &local_128) {
    operator_delete(local_138,
                    CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

inline void server_t::parse_tree(node& n, const std::string& s, const func_t& fn) {
  auto pos = s.find('/', 1);
  auto placeholder = s[1] == ':';
  if (pos == std::string::npos) {
    bool found = false;
    auto sub = s.substr(placeholder ? 2 : 1);
    for (auto& vv : n.children) {
      if (vv.name == sub) {
        found = true;
        break;
      }
    }
    if (!found) {
      node nn =  {
        .name = std::move(sub),
        .fn = fn,
        .placeholder = placeholder,
      };
      n.children.emplace_back(nn);
    }
    return;
  }
  auto sub = s.substr(1, pos - 1);
  if (placeholder) sub = sub.substr(1);
  bool found = false;
  for (auto& vv : n.children) {
    if (vv.name == sub) {
      found = true;
      parse_tree(vv, s.substr(pos), fn);
      break;
    }
  }
  if (!found) {
    node nn = {
      .name = std::move(sub),
      .placeholder = placeholder,
    };
    parse_tree(nn, s.substr(pos), fn);
    n.children.emplace_back(std::move(nn));
  }
}